

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O2

bool __thiscall tinyusdz::AttrMetas::has_unauthoredValuesIndex(AttrMetas *this)

{
  size_type sVar1;
  allocator local_31;
  key_type local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,"unauthoredValuesIndex",&local_31);
  sVar1 = ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
          ::count(&this->meta,&local_30);
  ::std::__cxx11::string::_M_dispose();
  return sVar1 != 0;
}

Assistant:

bool AttrMetas::has_unauthoredValuesIndex() const {
  return meta.count("unauthoredValuesIndex");
}